

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::initializeSubpassIsSecondary
               (vector<bool,_std::allocator<bool>_> *subpassIsSecondary,
               vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
               *subpasses,CommandBufferTypes commandBuffer)

{
  bool bVar1;
  size_type sVar2;
  ulong local_28;
  size_t subpassNdx;
  bool lastSubpassWasSecondary;
  CommandBufferTypes commandBuffer_local;
  vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
  *subpasses_local;
  vector<bool,_std::allocator<bool>_> *subpassIsSecondary_local;
  
  bVar1 = false;
  for (local_28 = 0;
      sVar2 = std::
              vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
              ::size(subpasses), local_28 < sVar2; local_28 = local_28 + 1) {
    if ((commandBuffer == COMMANDBUFFERTYPES_SECONDARY) ||
       (((commandBuffer & COMMANDBUFFERTYPES_SECONDARY) != 0 && (!bVar1)))) {
      std::vector<bool,_std::allocator<bool>_>::push_back(subpassIsSecondary,true);
      bVar1 = true;
    }
    else if ((commandBuffer & COMMANDBUFFERTYPES_INLINE) != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back(subpassIsSecondary,false);
      bVar1 = false;
    }
  }
  return;
}

Assistant:

void initializeSubpassIsSecondary (vector<bool>& subpassIsSecondary, const vector<Subpass>& subpasses, TestConfig::CommandBufferTypes commandBuffer)
{
	bool lastSubpassWasSecondary = false;

	for (size_t subpassNdx = 0; subpassNdx < subpasses.size(); subpassNdx++)
	{
		if (commandBuffer == TestConfig::COMMANDBUFFERTYPES_SECONDARY || (commandBuffer & TestConfig::COMMANDBUFFERTYPES_SECONDARY && !lastSubpassWasSecondary))
		{
			subpassIsSecondary.push_back(true);
			lastSubpassWasSecondary = true;
		}
		else if (commandBuffer & TestConfig::COMMANDBUFFERTYPES_INLINE)
		{
			subpassIsSecondary.push_back(false);
			lastSubpassWasSecondary = false;
		}
		else
			DE_FATAL("Unknown commandBuffer");
	}
}